

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O2

void __thiscall
Js::AsmJsByteCodeWriter::AsmCall
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,RegSlot returnValueRegister,
          RegSlot functionRegister,ArgSlot givenArgCount,AsmJsRetType retType,ProfileId profileId)

{
  code *pcVar1;
  ProfileId PVar2;
  bool bVar3;
  undefined4 *puVar4;
  OpCodeAsmJs local_32 [4];
  OpCodeAsmJs op_local;
  
  PVar2 = profileId;
  local_32[0] = op;
  bVar3 = ByteCodeWriter::DoDynamicProfileOpcode(&this->super_ByteCodeWriter,InlinePhase,false);
  if (PVar2 != 0xffff && bVar3) {
    bVar3 = OpCodeAttrAsmJs::HasProfiledOp(op);
    if (bVar3) {
      OpCodeUtilAsmJs::ConvertOpToProfiled(local_32);
      op = local_32[0];
    }
  }
  bVar3 = TryWriteAsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,op,returnValueRegister,functionRegister,givenArgCount,retType);
  if (!bVar3) {
    bVar3 = TryWriteAsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                      (this,local_32[0],returnValueRegister,functionRegister,givenArgCount,retType);
    if (!bVar3) {
      bVar3 = TryWriteAsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,local_32[0],returnValueRegister,functionRegister,givenArgCount,retType
                        );
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeWriter.cpp"
                                    ,0x25b,"(success)","success");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
    }
  }
  bVar3 = OpCodeAttrAsmJs::IsProfiledOp(local_32[0]);
  if (bVar3) {
    ByteCodeWriter::Data::Encode(&(this->super_ByteCodeWriter).m_byteCodeData,&profileId,2);
  }
  return;
}

Assistant:

void AsmJsByteCodeWriter::AsmCall(OpCodeAsmJs op, RegSlot returnValueRegister, RegSlot functionRegister, ArgSlot givenArgCount, AsmJsRetType retType, Js::ProfileId profileId)
    {
        if (DoDynamicProfileOpcode(InlinePhase) && profileId != Js::Constants::NoProfileId && OpCodeAttrAsmJs::HasProfiledOp(op))
        {
            OpCodeUtilAsmJs::ConvertOpToProfiled(&op);
        }
        MULTISIZE_LAYOUT_WRITE(AsmCall, op, returnValueRegister, functionRegister, givenArgCount, retType);
        if (OpCodeAttrAsmJs::IsProfiledOp(op))
        {
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
        }
    }